

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_attribute_struct **ppxVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  xml_allocator *this_00;
  bool bVar6;
  ulong uVar7;
  xml_attribute_struct **ppxVar8;
  xml_attribute_struct *pxVar9;
  
  pxVar2 = this->_root;
  if ((pxVar2 == (xml_node_struct *)0x0) ||
     (pxVar3 = a->_attr, pxVar3 == (xml_attribute_struct *)0x0)) {
    return false;
  }
  ppxVar1 = &pxVar2->first_attribute;
  ppxVar8 = ppxVar1;
  do {
    pxVar4 = *ppxVar8;
    if (pxVar4 == pxVar3) break;
    ppxVar8 = &pxVar4->next_attribute;
  } while (pxVar4 != (xml_attribute_struct *)0x0);
  if (pxVar4 == (xml_attribute_struct *)0x0) {
    bVar6 = false;
  }
  else {
    pxVar4 = pxVar3->prev_attribute_c;
    pxVar5 = pxVar3->next_attribute;
    pxVar9 = pxVar5;
    if (pxVar5 == (xml_attribute_struct *)0x0) {
      pxVar9 = *ppxVar1;
    }
    this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
    pxVar9->prev_attribute_c = pxVar4;
    ppxVar8 = &pxVar4->next_attribute;
    if (pxVar4->next_attribute == (xml_attribute_struct *)0x0) {
      ppxVar8 = ppxVar1;
    }
    *ppxVar8 = pxVar5;
    pxVar3->prev_attribute_c = (xml_attribute_struct *)0x0;
    pxVar3->next_attribute = (xml_attribute_struct *)0x0;
    pxVar3 = a->_attr;
    uVar7 = pxVar3->header;
    if ((uVar7 & 0x20) != 0) {
      impl::anon_unknown_0::xml_allocator::deallocate_string(this_00,pxVar3->name);
      uVar7 = pxVar3->header;
    }
    if ((uVar7 & 0x10) != 0) {
      impl::anon_unknown_0::xml_allocator::deallocate_string(this_00,pxVar3->value);
      uVar7 = pxVar3->header;
    }
    impl::anon_unknown_0::xml_allocator::deallocate_memory
              (this_00,pxVar3,0x28,(xml_memory_page *)((long)pxVar3 - (uVar7 >> 8)));
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

PUGI__FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;
		if (!impl::is_attribute_of(a._attr, _root)) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_attribute(a._attr, _root);
		impl::destroy_attribute(a._attr, alloc);

		return true;
	}